

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::cose::Sign1Message::Sign
          (Error *__return_storage_ptr__,Sign1Message *this,mbedtls_pk_context_conflict *aPrivateKey
          )

{
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  mbedtls_pk_type_t mVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar7;
  format_args args;
  format_args args_00;
  writer write;
  string local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  mbedtls_pk_info_t *local_98;
  eckey_t_conflict *peStack_90;
  size_t local_88;
  undefined8 local_80;
  format_string_checker<char> *local_78;
  parse_func local_70 [1];
  ErrorCode local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  writer local_38;
  
  __return_storage_ptr__->mCode = kNone;
  local_a0 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_a0;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar3 = mbedtls_pk_can_do(aPrivateKey,MBEDTLS_PK_ECDSA);
  if (iVar3 != 0) {
    local_88 = *(size_t *)&aPrivateKey->priv_id;
    local_98 = aPrivateKey->pk_info;
    peStack_90 = (eckey_t_conflict *)aPrivateKey->pk_ctx;
    mVar4 = mbedtls_pk_get_type((mbedtls_pk_context_conflict *)&local_98);
    if (peStack_90 != (eckey_t_conflict *)0x0 && 0xfffffffc < mVar4 - MBEDTLS_PK_RSA_ALT) {
      _Var2 = COSE_Sign0_Sign_eckey(this->mSign,peStack_90,(cose_errback *)0x0);
      if (_Var2) {
        return __return_storage_ptr__;
      }
      local_98 = (mbedtls_pk_info_t *)((ulong)local_98 & 0xffffffff00000000);
      peStack_90 = (eckey_t_conflict *)0x21b6dc;
      local_88 = 0x1e;
      local_80._0_4_ = 0;
      local_80._4_4_ = 0;
      local_70[0] = (parse_func)0x0;
      pcVar6 = "sign COSE SIGN1 message failed";
      local_78 = (format_string_checker<char> *)&local_98;
      do {
        pcVar5 = pcVar6 + 1;
        if (*pcVar6 == '}') {
          if ((pcVar5 == "") || (*pcVar5 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar5 = pcVar6 + 2;
        }
        else if (*pcVar6 == '{') {
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar6,"",(format_string_checker<char> *)&local_98);
        }
        pcVar6 = pcVar5;
      } while (pcVar5 != "");
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_98;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_c0,(v10 *)"sign COSE SIGN1 message failed",(string_view)ZEXT816(0x1e),
                 args_00);
      local_60 = kSecurity;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
      __return_storage_ptr__->mCode = local_60;
      goto LAB_0018212f;
    }
  }
  local_98 = (mbedtls_pk_info_t *)((ulong)local_98 & 0xffffffff00000000);
  pcVar6 = "sign COSE SIGN1 message without valid EC private key";
  peStack_90 = (eckey_t_conflict *)0x21b6a7;
  local_88 = 0x34;
  local_80._0_4_ = 0;
  local_80._4_4_ = 0;
  local_70[0] = (parse_func)0x0;
  local_78 = (format_string_checker<char> *)&local_98;
  local_38.handler_ = (format_string_checker<char> *)&local_98;
  do {
    if (pcVar6 == "") break;
    pcVar5 = pcVar6;
    if (*pcVar6 == '{') {
LAB_001820a0:
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_38,pcVar6,pcVar5);
      pcVar6 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar5,"",(format_string_checker<char> *)&local_98);
      bVar7 = true;
    }
    else {
      pcVar5 = pcVar6 + 1;
      bVar7 = pcVar5 != "";
      if (bVar7) {
        if (*pcVar5 != '{') {
          pcVar1 = pcVar6 + 2;
          do {
            pcVar5 = pcVar1;
            bVar7 = pcVar5 != "";
            if (pcVar5 == "") goto LAB_0018209c;
            pcVar1 = pcVar5 + 1;
          } while (*pcVar5 != '{');
        }
        bVar7 = true;
      }
LAB_0018209c:
      if (bVar7) goto LAB_001820a0;
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_38,pcVar6,"");
      bVar7 = false;
    }
  } while (bVar7);
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_98;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_c0,(v10 *)"sign COSE SIGN1 message without valid EC private key",
             (string_view)ZEXT816(0x34),args);
  local_60 = kInvalidArgs;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,local_c0._M_dataplus._M_p,
             local_c0._M_dataplus._M_p + local_c0._M_string_length);
  __return_storage_ptr__->mCode = local_60;
LAB_0018212f:
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::Sign(const mbedtls_pk_context &aPrivateKey)
{
    Error                      error;
    const mbedtls_ecp_keypair *eckey = nullptr;

    // Accepts only EC keys
    VerifyOrExit(mbedtls_pk_can_do(&aPrivateKey, MBEDTLS_PK_ECDSA) && (eckey = mbedtls_pk_ec(aPrivateKey)) != nullptr,
                 error = ERROR_INVALID_ARGS("sign COSE SIGN1 message without valid EC private key"));

    VerifyOrExit(COSE_Sign0_Sign_eckey(mSign, eckey, nullptr),
                 error = ERROR_SECURITY("sign COSE SIGN1 message failed"));

exit:
    return error;
}